

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

void __thiscall helics::FederateState::processDataMessage(FederateState *this,ActionMessage *cmd)

{
  long lVar1;
  long lVar2;
  TimeCoordinator *pTVar3;
  GlobalHandle *pGVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  bool bVar7;
  EndpointInfo *pEVar8;
  InputInfo *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 __s;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  string *psVar10;
  ActionMessage *command;
  ActionMessage *extraout_RDX_00;
  ActionMessage *extraout_RDX_01;
  ActionMessage *command_00;
  ActionMessage *extraout_RDX_03;
  ActionMessage *extraout_RDX_04;
  ActionMessage *extraout_RDX_05;
  ActionMessage *extraout_RDX_06;
  ActionMessage *extraout_RDX_07;
  ActionMessage *extraout_RDX_09;
  ActionMessage *pAVar11;
  Time TVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  GlobalHandle *pGVar13;
  string_view fmt;
  string_view logMessageSource;
  string_view fmt_00;
  string_view logMessageSource_00;
  string_view query;
  string_view logMessageSource_01;
  string_view fmt_01;
  string_view logMessageSource_02;
  string_view fmt_02;
  string_view logMessageSource_03;
  string_view logMessageSource_04;
  string_view fmt_03;
  string_view logMessageSource_05;
  format_args args;
  string_view message;
  format_args args_00;
  string_view message_00;
  string_view message_01;
  format_args args_01;
  string_view message_02;
  format_args args_02;
  string_view message_03;
  string_view message_04;
  format_args args_03;
  string_view message_05;
  string qres;
  string local_f0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_d0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_c8;
  size_t sStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  double local_a8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_90;
  string local_88;
  pointer local_60;
  SmallBuffer *local_58;
  SmallBuffer *local_50;
  GlobalHandle local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  ActionMessage *extraout_RDX;
  ActionMessage *extraout_RDX_02;
  ActionMessage *extraout_RDX_08;
  
  if (cmd->messageAction == cmd_pub) {
    this_00 = InterfaceInfo::getInput
                        (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid);
    if (this_00 != (InputInfo *)0x0) {
      pGVar13 = (this_00->input_sources).
                super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pGVar4 = (this_00->input_sources).
               super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pGVar13 != pGVar4) {
        do {
          if (((cmd->source_id).gid == (pGVar13->fed_id).gid) &&
             ((cmd->source_handle).hid == (pGVar13->handle).hid)) {
            lVar1 = (cmd->actionTime).internalTimeCode;
            TVar12.internalTimeCode = (this->time_granted).internalTimeCode;
            if (TVar12.internalTimeCode < lVar1) {
              TVar12.internalTimeCode = lVar1;
            }
            if (this->timeMethod != ASYNC) {
              TVar12.internalTimeCode = lVar1;
            }
            local_48 = *pGVar13;
            local_60 = (pointer)CONCAT44(local_60._4_4_,(uint)cmd->counter);
            local_50 = &cmd->payload;
            p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
            p_Var9->_M_use_count = 1;
            p_Var9->_M_weak_count = 1;
            p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00550c80;
            local_58 = (SmallBuffer *)(p_Var9 + 1);
            SmallBuffer::SmallBuffer(local_58,local_50);
            local_40._M_allocated_capacity = (size_type)local_58;
            local_40._8_8_ = p_Var9;
            bVar7 = InputInfo::addData(this_00,local_48,TVar12,(uint)local_60,
                                       (shared_ptr<const_helics::SmallBuffer> *)&local_40);
            pAVar11 = extraout_RDX_05;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
              pAVar11 = extraout_RDX_06;
            }
            if (bVar7) {
              if ((this_00->not_interruptible == false) &&
                 (TimeCoordinator::updateValueTime
                            ((this->timeCoord)._M_t.
                             super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                             .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,
                             TVar12,(bool)(this->timeGranted_mode ^ 1)),
                 sVar6 = gHelicsEmptyStr_abi_cxx11_._M_string_length, pAVar11 = extraout_RDX_07,
                 0x17 < this->maxLogLevel)) {
                local_60 = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
                (**(code **)((long)(((this->timeCoord)._M_t.
                                     super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                                     .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>.
                                    _M_head_impl)->super_BaseTimeCoordinator).
                                   _vptr_BaseTimeCoordinator + 0x58))(&local_c8);
                logMessageSource_04._M_str = local_60;
                logMessageSource_04._M_len = sVar6;
                message_04._M_str = (char *)local_c8.values_;
                message_04._M_len = sStack_c0;
                in_R9 = local_c8;
                logMessage(this,0x18,logMessageSource_04,message_04,false);
                pAVar11 = extraout_RDX_08;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8.values_ != &local_b8) {
                  operator_delete(local_c8.values_,(ulong)(local_b8._M_allocated_capacity + 1));
                  pAVar11 = extraout_RDX_09;
                }
              }
              sVar6 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
              _Var5._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
              if (0x11 < this->maxLogLevel) {
                prettyPrintString_abi_cxx11_(&local_88,(helics *)cmd,pAVar11);
                psVar10 = InputInfo::getSourceName_abi_cxx11_(this_00,*pGVar13);
                local_c8.values_ = (value<fmt::v11::context> *)local_88._M_dataplus._M_p;
                sStack_c0 = local_88._M_string_length;
                local_b8._M_allocated_capacity = (size_type)(psVar10->_M_dataplus)._M_p;
                local_b8._8_8_ = psVar10->_M_string_length;
                fmt_03.size_ = 0xdd;
                fmt_03.data_ = (char *)0x1e;
                args_03.field_1.args_ = in_R9.args_;
                args_03.desc_ = (unsigned_long_long)&local_c8;
                ::fmt::v11::vformat_abi_cxx11_
                          (&local_f0,(v11 *)"receive PUBLICATION {} from {}",fmt_03,args_03);
                logMessageSource_05._M_str = _Var5._M_p;
                logMessageSource_05._M_len = sVar6;
                message_05._M_str = local_f0._M_dataplus._M_p;
                message_05._M_len = local_f0._M_string_length;
                logMessage(this,0x12,logMessageSource_05,message_05,false);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                  operator_delete(local_88._M_dataplus._M_p,
                                  local_88.field_2._M_allocated_capacity + 1);
                }
              }
            }
            break;
          }
          pGVar13 = pGVar13 + 1;
        } while (pGVar13 != pGVar4);
      }
      if (EXECUTING < (this->state)._M_i) {
        return;
      }
      pTVar3 = (this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
      (**(code **)((long)(pTVar3->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x18))
                (pTVar3,cmd);
      return;
    }
    pEVar8 = InterfaceInfo::getEndpoint
                       (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid);
    if (pEVar8 == (EndpointInfo *)0x0) {
      return;
    }
    TimeCoordinator::updateMessageTime
              ((this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,
               (Time)(cmd->actionTime).internalTimeCode,(bool)(this->timeGranted_mode ^ 1));
    sVar6 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var5 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    pAVar11 = command_00;
    if (0x11 < this->maxLogLevel) {
      prettyPrintString_abi_cxx11_(&local_f0,(helics *)cmd,command_00);
      local_88._M_dataplus._M_p = local_f0._M_dataplus._M_p;
      local_88._M_string_length = local_f0._M_string_length;
      fmt_01.size_ = 0xd;
      fmt_01.data_ = (char *)0x12;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)&local_88;
      ::fmt::v11::vformat_abi_cxx11_((string *)&local_c8,(v11 *)"receive_message {}",fmt_01,args_01)
      ;
      logMessageSource_02._M_str = _Var5._M_p;
      logMessageSource_02._M_len = sVar6;
      message_02._M_str = (char *)local_c8.values_;
      message_02._M_len = sStack_c0;
      in_R9 = local_c8;
      logMessage(this,0x12,logMessageSource_02,message_02,false);
      pAVar11 = extraout_RDX_02;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.values_ != &local_b8) {
        operator_delete(local_c8.values_,(ulong)(local_b8._M_allocated_capacity + 1));
        pAVar11 = extraout_RDX_03;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        pAVar11 = extraout_RDX_04;
      }
    }
    sVar6 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var5._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (((cmd->actionTime).internalTimeCode < (this->time_granted).internalTimeCode) &&
       (this->timeMethod != ASYNC)) {
      prettyPrintString_abi_cxx11_(&local_88,(helics *)cmd,pAVar11);
      lVar1 = (cmd->actionTime).internalTimeCode;
      lVar2 = (this->time_granted).internalTimeCode;
      local_b8._M_allocated_capacity =
           (size_type)((double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000));
      local_a8 = (double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000);
      local_c8.values_ = (value<fmt::v11::context> *)local_88._M_dataplus._M_p;
      sStack_c0 = local_88._M_string_length;
      fmt_02.size_ = 0xaad;
      fmt_02.data_ = (char *)0x3d;
      args_02.field_1.values_ = in_R9.values_;
      args_02.desc_ = (unsigned_long_long)&local_c8;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_f0,(v11 *)"received message {} at time({}) earlier than granted time({})",
                 fmt_02,args_02);
      logMessageSource_03._M_str = _Var5._M_p;
      logMessageSource_03._M_len = sVar6;
      message_03._M_str = local_f0._M_dataplus._M_p;
      message_03._M_len = local_f0._M_string_length;
      logMessage(this,3,logMessageSource_03,message_03,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    __s.values_ = (value<fmt::v11::context> *)operator_new(0x100);
    memset(__s.values_,0,0xf8);
    *(undefined8 *)&__s.args_[2].field_0x18 = 0x40;
    __s.args_[3].value_.field_0.named_args.data = (named_arg_info<char> *)&(__s.args_)->type_;
    (((string *)(__s.values_ + 7))->_M_dataplus)._M_p = (pointer)(__s.values_ + 8);
    (((string *)(__s.values_ + 9))->_M_dataplus)._M_p = (pointer)(__s.values_ + 10);
    (((string *)(__s.values_ + 0xb))->_M_dataplus)._M_p = (pointer)(__s.values_ + 0xc);
    (((string *)(__s.values_ + 0xd))->_M_dataplus)._M_p = (pointer)(__s.values_ + 0xe);
    *(void **)((long)(__s.values_ + 0xf) + 8) = (void *)0x0;
    local_c8.values_ = __s.values_;
    SmallBuffer::operator=((SmallBuffer *)&(__s.args_)->type_,&cmd->payload);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (__s.values_ + 7),&pEVar8->key);
    *(uint16_t *)((long)&(__s.values_)->field_0 + 8) = cmd->flags;
    ((__s.values_)->field_0).long_long_value = (cmd->actionTime).internalTimeCode;
    *(uint *)(__s.values_ + 0xf) = (uint)cmd->counter;
    *(int32_t *)((long)&(__s.values_)->field_0 + 0xc) = cmd->messageID;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (__s.values_ + 0xd),&pEVar8->key);
    local_d0.args_ = local_c8.args_;
    local_c8.values_ = (value<fmt::v11::context> *)0x0;
    EndpointInfo::addMessage
              (pEVar8,(unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                      &local_d0);
    if ((Message *)local_d0.values_ != (Message *)0x0) {
      std::default_delete<helics::Message>::operator()
                ((default_delete<helics::Message> *)&local_d0,(Message *)local_d0.values_);
    }
    local_d0.values_ = (value<fmt::v11::context> *)0x0;
    if ((this->state)._M_i < TERMINATING) {
      pTVar3 = (this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
      (**(code **)((long)(pTVar3->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x18))
                (pTVar3,cmd);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.values_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return;
    }
    this_01 = &local_c8;
    local_90 = local_c8;
  }
  else {
    if (cmd->messageAction != cmd_send_message) {
      return;
    }
    pEVar8 = InterfaceInfo::getEndpoint
                       (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid);
    if (pEVar8 == (EndpointInfo *)0x0) {
      return;
    }
    if (pEVar8->sourceOnly != false) {
      return;
    }
    TVar12.internalTimeCode = (cmd->actionTime).internalTimeCode;
    lVar1 = (this->minimumReceiveTime).internalTimeCode;
    if (TVar12.internalTimeCode < lVar1) {
      (cmd->actionTime).internalTimeCode = lVar1;
      TVar12.internalTimeCode = lVar1;
    }
    TimeCoordinator::updateMessageTime
              ((this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,TVar12,
               (bool)(this->timeGranted_mode ^ 1));
    sVar6 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var5 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    pAVar11 = command;
    if (0x11 < this->maxLogLevel) {
      prettyPrintString_abi_cxx11_(&local_f0,(helics *)cmd,command);
      local_88._M_dataplus._M_p = local_f0._M_dataplus._M_p;
      local_88._M_string_length = local_f0._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x12;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&local_88;
      ::fmt::v11::vformat_abi_cxx11_((string *)&local_c8,(v11 *)"receive_message {}",fmt,args);
      logMessageSource._M_str = _Var5._M_p;
      logMessageSource._M_len = sVar6;
      message._M_str = (char *)local_c8.values_;
      message._M_len = sStack_c0;
      in_R9 = local_c8;
      logMessage(this,0x12,logMessageSource,message,false);
      pAVar11 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.values_ != &local_b8) {
        operator_delete(local_c8.values_,(ulong)(local_b8._M_allocated_capacity + 1));
        pAVar11 = extraout_RDX_00;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        pAVar11 = extraout_RDX_01;
      }
    }
    sVar6 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var5._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (((cmd->actionTime).internalTimeCode < (this->time_granted).internalTimeCode) &&
       (this->timeMethod != ASYNC)) {
      prettyPrintString_abi_cxx11_(&local_88,(helics *)cmd,pAVar11);
      lVar1 = (cmd->actionTime).internalTimeCode;
      lVar2 = (this->time_granted).internalTimeCode;
      local_b8._M_allocated_capacity =
           (size_type)((double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000));
      local_a8 = (double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000);
      local_c8.values_ = (value<fmt::v11::context> *)local_88._M_dataplus._M_p;
      sStack_c0 = local_88._M_string_length;
      fmt_00.size_ = 0xaad;
      fmt_00.data_ = (char *)0x3d;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&local_c8;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_f0,(v11 *)"received message {} at time({}) earlier than granted time({})",
                 fmt_00,args_00);
      logMessageSource_00._M_str = _Var5._M_p;
      logMessageSource_00._M_len = sVar6;
      message_00._M_str = local_f0._M_dataplus._M_p;
      message_00._M_len = local_f0._M_string_length;
      logMessage(this,3,logMessageSource_00,message_00,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      query._M_str = "global_time_debugging";
      query._M_len = 0x15;
      processQueryActual_abi_cxx11_((string *)&local_c8,this,query);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8,0,0,
                 "TIME DEBUGGING::",0x10);
      logMessageSource_01._M_str = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
      logMessageSource_01._M_len = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      message_01._M_str = (char *)local_c8.values_;
      message_01._M_len = sStack_c0;
      logMessage(this,3,logMessageSource_01,message_01,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.values_ != &local_b8) {
        operator_delete(local_c8.values_,(ulong)(local_b8._M_allocated_capacity + 1));
      }
    }
    if ((this->state)._M_i < TERMINATING) {
      pTVar3 = (this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
      (**(code **)((long)(pTVar3->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x18))
                (pTVar3,cmd);
    }
    createMessageFromCommand((helics *)&local_90,cmd);
    EndpointInfo::addMessage
              (pEVar8,(unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                      &local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.values_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return;
    }
    this_01 = &local_90;
  }
  std::default_delete<helics::Message>::operator()
            ((default_delete<helics::Message> *)this_01,(Message *)local_90.values_);
  return;
}

Assistant:

void FederateState::processDataMessage(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_SEND_MESSAGE: {
            auto* epi = interfaceInformation.getEndpoint(cmd.dest_handle);
            if (epi != nullptr && !epi->sourceOnly) {
                if (cmd.actionTime < minimumReceiveTime) {
                    cmd.actionTime = minimumReceiveTime;
                }
                // if (!epi->not_interruptible)
                {
                    timeCoord->updateMessageTime(cmd.actionTime, !timeGranted_mode);
                }
                LOG_DATA(fmt::format("receive_message {}", prettyPrintString(cmd)));
                if (cmd.actionTime < time_granted &&
                    timeMethod != TimeSynchronizationMethod::ASYNC) {
                    LOG_WARNING(
                        fmt::format("received message {} at time({}) earlier than granted time({})",
                                    prettyPrintString(cmd),
                                    static_cast<double>(cmd.actionTime),
                                    static_cast<double>(time_granted)));
                    auto qres = processQueryActual("global_time_debugging");
                    qres.insert(0, "TIME DEBUGGING::");
                    LOG_WARNING(qres);
                }

                if (state <= FederateStates::EXECUTING) {
                    timeCoord->processTimeMessage(cmd);
                }
                epi->addMessage(createMessageFromCommand(std::move(cmd)));
            }
        } break;
        case CMD_PUB: {
            auto* subI = interfaceInformation.getInput(InterfaceHandle(cmd.dest_handle));
            if (subI == nullptr) {
                auto* eptI = interfaceInformation.getEndpoint(cmd.dest_handle);
                if (eptI != nullptr) {
                    // if (!epi->not_interruptible)
                    {
                        timeCoord->updateMessageTime(cmd.actionTime, !timeGranted_mode);
                    }
                    LOG_DATA(fmt::format("receive_message {}", prettyPrintString(cmd)));
                    if (cmd.actionTime < time_granted &&
                        timeMethod != TimeSynchronizationMethod::ASYNC) {
                        LOG_WARNING(fmt::format(
                            "received message {} at time({}) earlier than granted time({})",
                            prettyPrintString(cmd),
                            static_cast<double>(cmd.actionTime),
                            static_cast<double>(time_granted)));
                    }
                    auto mess = std::make_unique<Message>();
                    mess->data = std::move(cmd.payload);
                    mess->dest = eptI->key;
                    mess->flags = cmd.flags;
                    mess->time = cmd.actionTime;
                    mess->counter = cmd.counter;
                    mess->messageID = cmd.messageID;
                    mess->original_dest = eptI->key;
                    eptI->addMessage(std::move(mess));
                    if (state <= FederateStates::EXECUTING) {
                        timeCoord->processTimeMessage(cmd);
                    }
                }
                break;
            }
            for (auto& src : subI->input_sources) {
                auto valueTime = cmd.actionTime;
                if (timeMethod == TimeSynchronizationMethod::ASYNC) {
                    if (valueTime < time_granted) {
                        valueTime = time_granted;
                    }
                }
                if ((cmd.source_id == src.fed_id) && (cmd.source_handle == src.handle)) {
                    if (subI->addData(src,
                                      valueTime,
                                      cmd.counter,
                                      std::make_shared<const SmallBuffer>(
                                          std::move(cmd.payload)))) {
                        if (!subI->not_interruptible) {
                            timeCoord->updateValueTime(valueTime, !timeGranted_mode);
                            LOG_TRACE(timeCoord->printTimeStatus());
                        }
                        LOG_DATA(fmt::format("receive PUBLICATION {} from {}",
                                             prettyPrintString(cmd),
                                             subI->getSourceName(src)));
                    }
                    // this can only match once
                    break;
                }
            }
            if (state <= FederateStates::EXECUTING) {
                timeCoord->processTimeMessage(cmd);
            }
        } break;
        default:
            break;
    }
}